

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O3

void __thiscall uv::TCPClient::send_inl(TCPClient *this,uv_write_t *req)

{
  char *__s;
  size_t *psVar1;
  uv_mutex_t *puVar2;
  char *pcVar3;
  FILE *__stream;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  _List_node_base *p_Var9;
  ssize_t sVar10;
  _List_node_base *p_Var11;
  ILog4zManager *pIVar12;
  undefined8 uVar13;
  char *pcVar14;
  char *pcVar15;
  void *__buf;
  int iVar16;
  int iVar17;
  ulong *in_FS_OFFSET;
  string local_50;
  
  if (req != (uv_write_t *)0x0) {
    if ((this->writeparam_list_).
        super__List_base<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>._M_impl._M_node.
        _M_size < 0x15) {
      p_Var11 = (_List_node_base *)operator_new(0x18);
      p_Var11[1]._M_next = (_List_node_base *)req;
      std::__detail::_List_node_base::_M_hook(p_Var11);
      psVar1 = &(this->writeparam_list_).
                super__List_base<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      free(req[1].data);
      free(req);
    }
  }
  puVar2 = &this->mutex_writebuf_;
  uv_mutex_lock();
  if ((this->write_circularbuf_).m_bEmpty == false) {
    pcVar3 = (char *)*in_FS_OFFSET;
    __s = pcVar3 + -0x7f9;
    pcVar8 = pcVar3 + -1;
    pcVar14 = __s;
    do {
      p_Var11 = (this->writeparam_list_).
                super__List_base<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>._M_impl.
                _M_node.super__List_node_base._M_next;
      if (p_Var11 == (_List_node_base *)&this->writeparam_list_) {
        p_Var9 = (_List_node_base *)malloc(0xd8);
        p_Var11 = (_List_node_base *)malloc(0x2800);
        iVar4 = (int)p_Var11;
        p_Var9[0xc]._M_next = p_Var11;
        p_Var9[0xc]._M_prev = (_List_node_base *)0x2800;
        *(undefined4 *)&p_Var9[0xd]._M_next = 0x2800;
        p_Var9->_M_next = (_List_node_base *)this;
        __buf = (void *)0x2800;
      }
      else {
        p_Var9 = p_Var11[1]._M_next;
        psVar1 = &(this->writeparam_list_).
                  super__List_base<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var11,0x18);
        iVar4 = (int)p_Var9[0xc]._M_next;
        __buf = (void *)(ulong)*(uint *)&p_Var9[0xd]._M_next;
      }
      sVar10 = PodCircularBuffer<char>::read(&this->write_circularbuf_,iVar4,__buf,(size_t)pcVar14);
      p_Var9[0xc]._M_prev = (_List_node_base *)(long)(int)sVar10;
      uv_mutex_unlock(puVar2);
      pcVar14 = (char *)0x1;
      iVar4 = uv_write(p_Var9,this->client_handle_,p_Var9 + 0xc,1,AfterSend);
      if (iVar4 != 0) {
        p_Var11 = (_List_node_base *)operator_new(0x18);
        p_Var11[1]._M_next = p_Var9;
        std::__detail::_List_node_base::_M_hook(p_Var11);
        psVar1 = &(this->writeparam_list_).
                  super__List_base<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        builtin_strncpy(pcVar3 + -0x800,"client(",8);
        uVar5 = snprintf(__s,0x7f9,"%016llx",this);
        iVar16 = (int)pcVar3;
        if ((int)uVar5 < 0) {
          *__s = '\0';
          pcVar14 = __s;
LAB_0011b2a3:
          iVar17 = iVar16 - (int)pcVar14;
          iVar6 = snprintf(pcVar14,(long)iVar17,"%s",") send error:");
          pcVar15 = pcVar14;
          iVar7 = 0;
          if (iVar6 < 0) {
LAB_0011b2db:
            iVar6 = iVar7;
            *pcVar15 = '\0';
          }
          else {
            pcVar15 = pcVar8;
            iVar7 = iVar17;
            if (iVar17 <= iVar6) goto LAB_0011b2db;
          }
          pcVar14 = pcVar14 + iVar6;
        }
        else {
          if (uVar5 < 0x7f9) {
            pcVar14 = __s + uVar5;
            goto LAB_0011b2a3;
          }
          *pcVar8 = '\0';
          pcVar14 = pcVar3;
        }
        GetUVError_abi_cxx11_(&local_50,iVar4);
        if (pcVar14 < pcVar3) {
          iVar17 = iVar16 - (int)pcVar14;
          iVar6 = snprintf(pcVar14,(long)iVar17,"%s",local_50._M_dataplus._M_p);
          pcVar15 = pcVar14;
          iVar7 = 0;
          if (iVar6 < 0) {
LAB_0011b33b:
            iVar6 = iVar7;
            *pcVar15 = '\0';
          }
          else {
            pcVar15 = pcVar8;
            iVar7 = iVar17;
            if (iVar17 <= iVar6) goto LAB_0011b33b;
          }
          pcVar14 = pcVar14 + iVar6;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (pcVar14 < pcVar3) {
          iVar17 = iVar16 - (int)pcVar14;
          iVar6 = snprintf(pcVar14,(long)iVar17,"%s"," ( ");
          pcVar15 = pcVar14;
          iVar7 = 0;
          if (iVar6 < 0) {
LAB_0011b39f:
            iVar6 = iVar7;
            *pcVar15 = '\0';
          }
          else {
            pcVar15 = pcVar8;
            iVar7 = iVar17;
            if (iVar17 <= iVar6) goto LAB_0011b39f;
          }
          pcVar14 = pcVar14 + iVar6;
        }
        if (pcVar14 < pcVar3) {
          iVar17 = iVar16 - (int)pcVar14;
          iVar6 = snprintf(pcVar14,(long)iVar17,"%s"," ");
          pcVar15 = pcVar14;
          iVar7 = 0;
          if (iVar6 < 0) {
LAB_0011b3e7:
            iVar6 = iVar7;
            *pcVar15 = '\0';
          }
          else {
            pcVar15 = pcVar8;
            iVar7 = iVar17;
            if (iVar17 <= iVar6) goto LAB_0011b3e7;
          }
          pcVar14 = pcVar14 + iVar6;
        }
        if (pcVar14 < pcVar3) {
          iVar17 = iVar16 - (int)pcVar14;
          iVar6 = snprintf(pcVar14,(long)iVar17,"%s"," ) : ");
          pcVar15 = pcVar14;
          iVar7 = 0;
          if (iVar6 < 0) {
LAB_0011b42f:
            iVar6 = iVar7;
            *pcVar15 = '\0';
          }
          else {
            pcVar15 = pcVar8;
            iVar7 = iVar17;
            if (iVar17 <= iVar6) goto LAB_0011b42f;
          }
          pcVar14 = pcVar14 + iVar6;
        }
        if (pcVar14 < pcVar3) {
          iVar16 = iVar16 - (int)pcVar14;
          iVar7 = snprintf(pcVar14,(long)iVar16,"%d",0x1e9);
          if ((iVar7 < 0) || (pcVar14 = pcVar8, iVar16 <= iVar7)) {
            *pcVar14 = '\0';
          }
        }
        pIVar12 = zsummer::log4z::ILog4zManager::GetInstance();
        (*pIVar12->_vptr_ILog4zManager[8])(pIVar12,0,3,pcVar3 + -0x800);
        __stream = _stdout;
        uVar13 = uv_err_name(iVar4);
        pcVar14 = (char *)uv_strerror(iVar4);
        fprintf(__stream,"send error. %s-%s\n",uVar13);
      }
      uv_mutex_lock(puVar2);
    } while ((this->write_circularbuf_).m_bEmpty == false);
  }
  uv_mutex_unlock(puVar2);
  return;
}

Assistant:

void TCPClient::send_inl(uv_write_t* req /*= NULL*/)
{
    write_param* writep = (write_param*)req;
    if (writep) {
        if (writeparam_list_.size() > MAXLISTSIZE) {
            FreeWriteParam(writep);
        } else {
            writeparam_list_.push_back(writep);
        }
    }
    while (true) {
        uv_mutex_lock(&mutex_writebuf_);
        if (write_circularbuf_.empty()) {
            uv_mutex_unlock(&mutex_writebuf_);
            break;
        }
        if (writeparam_list_.empty()) {
            writep = AllocWriteParam();
            writep->write_req_.data = this;
        } else {
            writep = writeparam_list_.front();
            writeparam_list_.pop_front();
        }
        writep->buf_.len = write_circularbuf_.read(writep->buf_.base, writep->buf_truelen_); 
        uv_mutex_unlock(&mutex_writebuf_);
        int iret = uv_write((uv_write_t*)&writep->write_req_, (uv_stream_t*)&client_handle_->tcphandle, &writep->buf_, 1, AfterSend);
        if (iret) {
            writeparam_list_.push_back(writep);//failure not call AfterSend. so recycle req
            LOGE("client(" << this << ") send error:" << GetUVError(iret));
            fprintf(stdout, "send error. %s-%s\n", uv_err_name(iret), uv_strerror(iret));
        }
    }
}